

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O2

cx_string<3UL>
mserialize::detail::BuiltinTag<std::vector<std::tuple<>,_std::allocator<std::tuple<>_>_>,_void>::
tag_string(void)

{
  cx_string<2UL> cVar1;
  cx_string<3UL> cVar2;
  cx_string<1UL> local_e;
  cx_string<2UL> local_c;
  
  local_e._data[0] = '[';
  local_e._data[1] = '\0';
  cVar1 = BuiltinTag<std::tuple<>,_void>::tag_string();
  local_c._data._0_2_ = cVar1._data._0_2_;
  local_c._data[2] = cVar1._data[2];
  cVar2 = cx_strcat<1ul,2ul>(&local_e,&local_c);
  return (cx_string<3UL>)cVar2._data;
}

Assistant:

static constexpr auto tag_string()
  {
    return cx_strcat(
      make_cx_string("["),
      Tag<sequence_value_t<Sequence>>::type::tag_string()
    );
  }